

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O0

void __thiscall
ON_LinearWorkflow::ApplyPreProcessGamma(ON_LinearWorkflow *this,ON_4fColor *col,bool for_texture)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  float f1;
  float fVar4;
  bool local_32;
  byte local_31;
  float *f;
  float gamma;
  bool check;
  bool for_texture_local;
  ON_4fColor *col_local;
  ON_LinearWorkflow *this_local;
  
  if (for_texture) {
    iVar2 = (*this->_vptr_ON_LinearWorkflow[5])();
    local_31 = (byte)iVar2;
  }
  else {
    iVar2 = (*this->_vptr_ON_LinearWorkflow[7])();
    local_31 = (byte)iVar2;
  }
  if ((local_31 & 1) != 0) {
    (*this->_vptr_ON_LinearWorkflow[0xd])();
    bVar1 = IsFloatEqual(f1,1.0);
    if (!bVar1) {
      pfVar3 = ON_4fColor::FloatArray(col);
      local_32 = false;
      if ((0.0 <= *pfVar3) && (local_32 = false, 0.0 <= pfVar3[1])) {
        local_32 = 0.0 <= pfVar3[2];
      }
      ON_REMOVE_ASAP_AssertEx
                ((uint)local_32,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linear_workflow.cpp"
                 ,0xb6,"","(f[0] >= 0.0) && (f[1] >= 0.0) && (f[2] >= 0.0) is false");
      if (0.0 < *pfVar3) {
        fVar4 = powf(*pfVar3,f1);
        *pfVar3 = fVar4;
      }
      if (0.0 < pfVar3[1]) {
        fVar4 = powf(pfVar3[1],f1);
        pfVar3[1] = fVar4;
      }
      if (0.0 < pfVar3[2]) {
        fVar4 = powf(pfVar3[2],f1);
        pfVar3[2] = fVar4;
      }
    }
  }
  return;
}

Assistant:

void ON_LinearWorkflow::ApplyPreProcessGamma(ON_4fColor& col, bool for_texture) const
{
  const bool check = for_texture ? PreProcessTexturesOn() : PreProcessColorsOn();
  if (!check)
    return;

  const float gamma = PreProcessGamma();
  if (!IsFloatEqual(gamma, 1.0f))
  {
    float* f = col.FloatArray();

    ON_ASSERT((f[0] >= 0.0) && (f[1] >= 0.0) && (f[2] >= 0.0));

    if (f[0] > 0.0) f[0] = powf(f[0], gamma);
    if (f[1] > 0.0) f[1] = powf(f[1], gamma);
    if (f[2] > 0.0) f[2] = powf(f[2], gamma);
  }
}